

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void __thiscall testing::internal::PrintTo(internal *this,__uint128_t v,ostream *os)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ostream *in_RDX;
  char *pcVar3;
  char buf [40];
  
  if (this != (internal *)0x0 || os != (ostream *)0x0) {
    pcVar3 = buf + 0x27;
    buf[0x27] = '\0';
    for (; os != (ostream *)0x0 || this != (internal *)0x0; os = (ostream *)((ulong)os / 10)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = os;
      uVar2 = (short)((ulong)this % 10) + SUB162(auVar1 % ZEXT816(10),0) * 6;
      this = (internal *)
             ((ulong)(byte)(uVar2 / 10) +
             SUB168(auVar1 % ZEXT816(10),0) * 0x1999999999999999 + (ulong)this / 10);
      pcVar3[-1] = (byte)(uVar2 % 10) | 0x30;
      pcVar3 = pcVar3 + -1;
    }
    std::operator<<(in_RDX,pcVar3);
    return;
  }
  std::operator<<(in_RDX,"0");
  return;
}

Assistant:

void PrintTo(__uint128_t v, ::std::ostream* os) {
  if (v == 0) {
    *os << "0";
    return;
  }

  // Buffer large enough for ceil(log10(2^128))==39 and the null terminator
  char buf[40];
  char* p = buf + sizeof(buf);

  // Some configurations have a __uint128_t, but no support for built in
  // division. Do manual long division instead.

  uint64_t high = static_cast<uint64_t>(v >> 64);
  uint64_t low = static_cast<uint64_t>(v);

  *--p = 0;
  while (high != 0 || low != 0) {
    uint64_t high_mod = high % 10;
    high = high / 10;
    // This is the long division algorithm specialized for a divisor of 10 and
    // only two elements.
    // Notable values:
    //   2^64 / 10 == 1844674407370955161
    //   2^64 % 10 == 6
    const uint64_t carry = 6 * high_mod + low % 10;
    low = low / 10 + high_mod * 1844674407370955161 + carry / 10;

    char digit = static_cast<char>(carry % 10);
    *--p = '0' + digit;
  }
  *os << p;
}